

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  size_t sVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  mbedtls_mpi_uint mVar8;
  size_t count;
  size_t sVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi T1;
  mbedtls_mpi Z;
  mbedtls_mpi_uint TP2 [3];
  mbedtls_mpi T2;
  
  iVar3 = mbedtls_mpi_cmp_int(B,0);
  if (iVar3 == 0) {
    return -0xc;
  }
  iVar4 = 1;
  X.n = 0;
  X.p = (mbedtls_mpi_uint *)0x0;
  Y.n = 0;
  Y.p = (mbedtls_mpi_uint *)0x0;
  Z.n = 0;
  Z.p = (mbedtls_mpi_uint *)0x0;
  T1.n = 0;
  T1.p = (mbedtls_mpi_uint *)0x0;
  T2.n = 3;
  T2.p = TP2;
  Y.s = iVar4;
  X.s = iVar4;
  T1.s = iVar4;
  Z.s = iVar4;
  T2.s = iVar4;
  iVar3 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar3 < 0) {
    if ((Q == (mbedtls_mpi *)0x0) || (iVar3 = mbedtls_mpi_lset(Q,0), iVar3 == 0)) {
      if (R == (mbedtls_mpi *)0x0) {
        return 0;
      }
      iVar3 = mbedtls_mpi_copy(R,A);
      if (iVar3 == 0) {
        return 0;
      }
    }
  }
  else {
    iVar3 = mbedtls_mpi_copy(&X,A);
    if ((((iVar3 == 0) && (iVar3 = mbedtls_mpi_copy(&Y,B), iVar3 == 0)) &&
        (Y.s = iVar4, X.s = iVar4, iVar3 = mbedtls_mpi_grow(&Z,A->n + 2), iVar3 == 0)) &&
       ((iVar3 = mbedtls_mpi_lset(&Z,0), iVar3 == 0 && (iVar3 = mbedtls_mpi_grow(&T1,2), iVar3 == 0)
        ))) {
      sVar5 = mbedtls_mpi_bitlen(&Y);
      uVar10 = (ulong)((uint)sVar5 & 0x3f);
      if (uVar10 == 0x3f) {
        sVar5 = 0;
      }
      else {
        sVar5 = uVar10 ^ 0x3f;
        iVar3 = mbedtls_mpi_shift_l(&X,sVar5);
        if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_shift_l(&Y,sVar5), iVar3 != 0)) goto LAB_0012038e;
      }
      sVar9 = X.n;
      sVar1 = Y.n;
      lVar6 = X.n - Y.n;
      count = lVar6 * 0x40;
      iVar3 = mbedtls_mpi_shift_l(&Y,count);
      if (iVar3 == 0) {
        do {
          iVar3 = mbedtls_mpi_cmp_mpi(&X,&Y);
          if (iVar3 < 0) {
            iVar3 = mbedtls_mpi_shift_r(&Y,count);
            if (iVar3 == 0) {
              goto LAB_00120434;
            }
            break;
          }
          Z.p[lVar6] = Z.p[lVar6] + 1;
          iVar3 = mbedtls_mpi_sub_mpi(&X,&X,&Y);
        } while (iVar3 == 0);
      }
    }
  }
  goto LAB_0012038e;
LAB_00120434:
  pmVar2 = X.p;
  uVar10 = sVar9 - 1;
  if (sVar1 - 1 < uVar10) {
    uVar7 = 0xffffffffffffffff;
    if (X.p[sVar9 - 1] < Y.p[sVar1 - 1]) {
      auVar11 = __udivti3(X.p[sVar9 - 2],X.p[sVar9 - 1],Y.p[sVar1 - 1],0);
      uVar7 = -(ulong)(auVar11._8_8_ != 0) | auVar11._0_8_;
    }
    Z.p[sVar9 + ~sVar1] = uVar7;
    if (uVar10 < 2) {
      TP2[0] = 0;
    }
    else {
      TP2[0] = pmVar2[sVar9 - 3];
    }
    TP2[1] = pmVar2[sVar9 - 2];
    TP2[2] = pmVar2[sVar9 - 1];
    lVar6 = sVar9 + ~sVar1;
    Z.p[lVar6] = Z.p[lVar6] + 1;
    do {
      Z.p[lVar6] = Z.p[lVar6] - 1;
      iVar3 = mbedtls_mpi_lset(&T1,0);
      if (iVar3 != 0) goto LAB_0012038e;
      if (sVar1 == 1) {
        mVar8 = 0;
      }
      else {
        mVar8 = Y.p[sVar1 - 2];
      }
      *T1.p = mVar8;
      T1.p[1] = Y.p[sVar1 - 1];
      iVar3 = mbedtls_mpi_mul_int(&T1,&T1,Z.p[lVar6]);
      if (iVar3 != 0) goto LAB_0012038e;
      iVar3 = mbedtls_mpi_cmp_mpi(&T1,&T2);
    } while (0 < iVar3);
    iVar3 = mbedtls_mpi_mul_int(&T1,&Y,Z.p[lVar6]);
    if (iVar3 != 0) goto LAB_0012038e;
    iVar3 = mbedtls_mpi_shift_l(&T1,lVar6 * 0x40);
    if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_sub_mpi(&X,&X,&T1), iVar3 != 0)) goto LAB_0012038e;
    iVar3 = mbedtls_mpi_cmp_int(&X,0);
    sVar9 = uVar10;
    if (iVar3 < 0) {
      iVar3 = mbedtls_mpi_copy(&T1,&Y);
      if (((iVar3 != 0) || (iVar3 = mbedtls_mpi_shift_l(&T1,lVar6 * 0x40), iVar3 != 0)) ||
         (iVar3 = mbedtls_mpi_add_mpi(&X,&X,&T1), iVar3 != 0)) goto LAB_0012038e;
      Z.p[lVar6] = Z.p[lVar6] - 1;
    }
    goto LAB_00120434;
  }
  if (Q != (mbedtls_mpi *)0x0) {
    iVar3 = mbedtls_mpi_copy(Q,&Z);
    if (iVar3 != 0) goto LAB_0012038e;
    Q->s = B->s * A->s;
  }
  if (R == (mbedtls_mpi *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = mbedtls_mpi_shift_r(&X,sVar5);
    if (iVar3 == 0) {
      X.s = A->s;
      iVar3 = mbedtls_mpi_copy(R,&X);
      if (iVar3 == 0) {
        iVar3 = 0;
        iVar4 = mbedtls_mpi_cmp_int(R,0);
        if (iVar4 == 0) {
          R->s = 1;
        }
      }
    }
  }
LAB_0012038e:
  mbedtls_mpi_free(&X);
  mbedtls_mpi_free(&Y);
  mbedtls_mpi_free(&Z);
  mbedtls_mpi_free(&T1);
  mbedtls_platform_zeroize(TP2,0x18);
  return iVar3;
}

Assistant:

int mbedtls_mpi_div_mpi( mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A,
                         const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;
    mbedtls_mpi_uint TP2[3];
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    if( mbedtls_mpi_cmp_int( B, 0 ) == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );
    mbedtls_mpi_init( &T1 );
    /*
     * Avoid dynamic memory allocations for constant-size T2.
     *
     * T2 is used for comparison only and the 3 limbs are assigned explicitly,
     * so nobody increase the size of the MPI and we're safe to use an on-stack
     * buffer.
     */
    T2.s = 1;
    T2.n = sizeof( TP2 ) / sizeof( *TP2 );
    T2.p = TP2;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
    {
        if( Q != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_lset( Q, 0 ) );
        if( R != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, A ) );
        return( 0 );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &X, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, B ) );
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &Z, A->n + 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Z,  0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T1, 2 ) );

    k = mbedtls_mpi_bitlen( &Y ) % biL;
    if( k < biL - 1 )
    {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &X, k ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, k ) );
    }
    else k = 0;

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, biL * ( n - t ) ) );

    while( mbedtls_mpi_cmp_mpi( &X, &Y ) >= 0 )
    {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &Y ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, biL * ( n - t ) ) );

    for( i = n; i > t ; i-- )
    {
        if( X.p[i] >= Y.p[t] )
            Z.p[i - t - 1] = ~0;
        else
        {
            Z.p[i - t - 1] = mbedtls_int_div_int( X.p[i], X.p[i - 1],
                                                            Y.p[t], NULL);
        }

        T2.p[0] = ( i < 2 ) ? 0 : X.p[i - 2];
        T2.p[1] = ( i < 1 ) ? 0 : X.p[i - 1];
        T2.p[2] = X.p[i];

        Z.p[i - t - 1]++;
        do
        {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T1, 0 ) );
            T1.p[0] = ( t < 1 ) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &T1, Z.p[i - t - 1] ) );
        }
        while( mbedtls_mpi_cmp_mpi( &T1, &T2 ) > 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &Y, Z.p[i - t - 1] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1,  biL * ( i - t - 1 ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &T1 ) );

        if( mbedtls_mpi_cmp_int( &X, 0 ) < 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &Y ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1, biL * ( i - t - 1 ) ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &X, &X, &T1 ) );
            Z.p[i - t - 1]--;
        }
    }

    if( Q != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( Q, &Z ) );
        Q->s = A->s * B->s;
    }

    if( R != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &X, k ) );
        X.s = A->s;
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, &X ) );

        if( mbedtls_mpi_cmp_int( R, 0 ) == 0 )
            R->s = 1;
    }

cleanup:

    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );
    mbedtls_mpi_free( &T1 );
    mbedtls_platform_zeroize( TP2, sizeof( TP2 ) );

    return( ret );
}